

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale.cc
# Opt level: O0

void libyuv::ScaleAddCols2_C
               (int dst_width,int boxheight,int x,int dx,uint16_t *src_ptr,uint8_t *dst_ptr)

{
  int iVar1;
  int iVar2;
  uint32_t uVar3;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  int in_EDI;
  long in_R8;
  undefined1 *in_R9;
  int ix;
  int boxwidth;
  int minboxwidth;
  int scaletbl [2];
  int i;
  int local_44;
  int local_40;
  int local_3c;
  int local_2c [3];
  undefined1 *local_20;
  long local_18;
  int local_10;
  int local_c;
  int local_4;
  
  iVar1 = in_ECX >> 0x10;
  local_3c = iVar1;
  if (iVar1 < 1) {
    local_3c = 1;
  }
  local_2c[0] = (int)(0x10000 / (long)(local_3c * in_ESI));
  if (iVar1 + 1 < 1) {
    local_40 = 1;
  }
  else {
    local_40 = iVar1 + 1;
  }
  local_2c[1] = (int)(0x10000 / (long)(local_40 * in_ESI));
  local_20 = in_R9;
  local_18 = in_R8;
  local_10 = in_ECX;
  local_c = in_EDX;
  local_4 = in_EDI;
  for (local_2c[2] = 0; local_2c[2] < local_4; local_2c[2] = local_2c[2] + 1) {
    iVar2 = local_c >> 0x10;
    local_c = local_10 + local_c;
    if ((local_c >> 0x10) - iVar2 < 1) {
      local_44 = 1;
    }
    else {
      local_44 = (local_c >> 0x10) - iVar2;
    }
    uVar3 = SumPixels(local_44,(uint16_t *)(local_18 + (long)iVar2 * 2));
    *local_20 = (char)(uVar3 * local_2c[local_44 - iVar1] >> 0x10);
    local_20 = local_20 + 1;
  }
  return;
}

Assistant:

static void ScaleAddCols2_C(int dst_width,
                            int boxheight,
                            int x,
                            int dx,
                            const uint16_t* src_ptr,
                            uint8_t* dst_ptr) {
  int i;
  int scaletbl[2];
  int minboxwidth = dx >> 16;
  int boxwidth;
  scaletbl[0] = 65536 / (MIN1(minboxwidth) * boxheight);
  scaletbl[1] = 65536 / (MIN1(minboxwidth + 1) * boxheight);
  for (i = 0; i < dst_width; ++i) {
    int ix = x >> 16;
    x += dx;
    boxwidth = MIN1((x >> 16) - ix);
    *dst_ptr++ =
        SumPixels(boxwidth, src_ptr + ix) * scaletbl[boxwidth - minboxwidth] >>
        16;
  }
}